

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ThreadPool *this;
  ostream *poVar1;
  clock_t cVar2;
  int j;
  int iVar3;
  int ppm;
  int ns;
  PARAMLIST_TYPE param_list;
  Server server;
  int local_388;
  int local_384;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
  local_380;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
  local_350;
  Server local_320;
  
  load_scene(&scene);
  w = (scene.camera)->width;
  h = (scene.camera)->height;
  std::operator<<((ostream *)&std::cout,"max depth: ");
  std::istream::operator>>(&std::cin,&MAX_DEP);
  std::operator<<((ostream *)&std::cout,"ppm (0 for server, >0 for rendering only): ");
  std::istream::operator>>(&std::cin,&local_388);
  std::operator<<((ostream *)&std::cout,"no. of threads: ");
  std::istream::operator>>(&std::cin,&local_384);
  this = (ThreadPool *)operator_new(200);
  ThreadPool::ThreadPool(this,(long)local_384);
  pool = this;
  if (local_388 < 1) {
    local_380._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_380._M_impl.super__Rb_tree_header._M_header;
    local_380._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_380._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_380._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_380._M_impl.super__Rb_tree_header._M_header._M_right =
         local_380._M_impl.super__Rb_tree_header._M_header._M_left;
    (*(scene.camera)->_vptr_Camera[3])(scene.camera,&local_380);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
    ::_Rb_tree(&local_350,&local_380);
    Server::Server(&local_320,reshade,(PARAMLIST_TYPE *)&local_350);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
    ::~_Rb_tree(&local_350);
    Server::run(&local_320,0x232a);
    Server::~Server(&local_320);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
    ::~_Rb_tree(&local_380);
  }
  else {
    clock();
    for (iVar3 = 0; iVar3 < local_388; iVar3 = iVar3 + 1) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"frame ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar3);
      std::endl<char,std::char_traits<char>>(poVar1);
      reshade(iVar3 != 0);
    }
    std::operator<<((ostream *)&std::cerr,"done. used ");
    cVar2 = clock();
    poVar1 = std::ostream::_M_insert<double>((double)cVar2 / 1000000.0);
    std::operator<<(poVar1,"s\n");
  }
  return 0;
}

Assistant:

int main(int argc,char**argv)
{
	load_scene(scene);
	w = scene.camera->width;
	h = scene.camera->height;
	std::cout << "max depth: ";
	std::cin >> MAX_DEP;
    std::cout << "ppm (0 for server, >0 for rendering only): ";
    int ppm;
    std::cin>>ppm;
	std::cout << "no. of threads: ";
	int ns;
	std::cin >> ns;
	pool = new ThreadPool(ns);
    if(ppm<=0)
    {
		PARAMLIST_TYPE param_list;
		scene.camera->dump(param_list);
        Server server(reshade, param_list);
    	server.run();
    }
    else
    {
        time_t tl=clock();
        for(int j=0;j<ppm;++j)
        {
            std::cerr<<"frame "<<j<<std::endl;
			reshade(j!=0);
        }
        std::cerr<<"done. used "<<clock()*1.0/CLOCKS_PER_SEC<<"s\n";
    }
}